

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcConstVal::set_sstr(CTcConstVal *this,char *val,size_t len)

{
  size_t in_RDX;
  CTcGenTarg *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 4;
  *(CTcGenTarg **)(in_RDI + 2) = in_RSI;
  *(size_t *)(in_RDI + 4) = in_RDX;
  CTcGenTarg::note_str(in_RSI,in_RDX);
  return;
}

Assistant:

void CTcConstVal::set_sstr(const char *val, size_t len)
{
    /* store the type */
    typ_ = TC_CVT_SSTR;

    /* store a pointer to the string */
    val_.strval_.strval_ = val;
    val_.strval_.strval_len_ = len;

    /* for image file layout purposes, record the length of this string */
    G_cg->note_str(len);
}